

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

void __thiscall QBoxLayout::setStretch(QBoxLayout *this,int index,int stretch)

{
  QBoxLayoutPrivate *pQVar1;
  QList<QBoxLayoutItem_*> *this_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  QBoxLayoutItem *box;
  QBoxLayoutPrivate *d;
  qsizetype in_stack_ffffffffffffffc8;
  
  pQVar1 = d_func((QBoxLayout *)0x2f5be4);
  if (-1 < in_ESI) {
    this_00 = (QList<QBoxLayoutItem_*> *)(long)in_ESI;
    qVar2 = QList<QBoxLayoutItem_*>::size(&pQVar1->list);
    if ((long)this_00 < qVar2) {
      ppQVar3 = QList<QBoxLayoutItem_*>::at(this_00,in_stack_ffffffffffffffc8);
      if ((*ppQVar3)->stretch != in_EDX) {
        (*ppQVar3)->stretch = in_EDX;
        (**(code **)(*in_RDI + 0x70))();
      }
    }
  }
  return;
}

Assistant:

void QBoxLayout::setStretch(int index, int stretch)
{
    Q_D(QBoxLayout);
    if (index >= 0 && index < d->list.size()) {
        QBoxLayoutItem *box = d->list.at(index);
        if (box->stretch != stretch) {
            box->stretch = stretch;
            invalidate();
        }
    }
}